

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

void cf_hc_reset(Curl_cfilter *cf,Curl_easy *data)

{
  undefined4 *puVar1;
  cf_hc_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (undefined4 *)cf->ctx;
  if (puVar1 != (undefined4 *)0x0) {
    cf_hc_baller_reset((cf_hc_baller *)(puVar1 + 10),data);
    cf_hc_baller_reset((cf_hc_baller *)(puVar1 + 0x16),data);
    *puVar1 = 0;
    puVar1[8] = 0;
    puVar1[0x23] = (data->set).happy_eyeballs_timeout;
    puVar1[0x22] = (data->set).happy_eyeballs_timeout >> 1;
  }
  return;
}

Assistant:

static void cf_hc_reset(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_hc_ctx *ctx = cf->ctx;

  if(ctx) {
    cf_hc_baller_reset(&ctx->h3_baller, data);
    cf_hc_baller_reset(&ctx->h21_baller, data);
    ctx->state = CF_HC_INIT;
    ctx->result = CURLE_OK;
    ctx->hard_eyeballs_timeout_ms = data->set.happy_eyeballs_timeout;
    ctx->soft_eyeballs_timeout_ms = data->set.happy_eyeballs_timeout / 2;
  }
}